

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_create(REF_HISTOGRAM *ref_histogram_ptr)

{
  REF_HISTOGRAM pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  int local_28;
  int local_24;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_HISTOGRAM ref_histogram;
  REF_HISTOGRAM *ref_histogram_ptr_local;
  
  pRVar1 = (REF_HISTOGRAM)malloc(0x50);
  *ref_histogram_ptr = pRVar1;
  if (*ref_histogram_ptr == (REF_HISTOGRAM)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x23,"ref_histogram_create","malloc *ref_histogram_ptr of REF_HISTOGRAM_STRUCT NULL");
    ref_histogram_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_histogram_ptr;
    pRVar1->nbin = 0x12;
    pRVar1->exp = 6.0;
    if (pRVar1->nbin < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x2a,"ref_histogram_create","malloc ref_histogram->bins of REF_INT negative");
      ref_histogram_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->nbin << 2);
      pRVar1->bins = pRVar2;
      if (pRVar1->bins == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x2a,"ref_histogram_create","malloc ref_histogram->bins of REF_INT NULL");
        ref_histogram_ptr_local._4_4_ = 2;
      }
      else {
        for (local_24 = 0; local_24 < pRVar1->nbin; local_24 = local_24 + 1) {
          pRVar1->bins[local_24] = 0;
        }
        pRVar1->max = -1e+20;
        pRVar1->min = 1e+20;
        pRVar1->log_total = 0.0;
        pRVar1->log_mean = 0.0;
        pRVar1->nstat = 5;
        if (pRVar1->nstat < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x34,"ref_histogram_create","malloc ref_histogram->stats of REF_DBL negative");
          ref_histogram_ptr_local._4_4_ = 1;
        }
        else {
          pRVar3 = (REF_DBL *)malloc((long)pRVar1->nstat << 3);
          pRVar1->stats = pRVar3;
          if (pRVar1->stats == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x34,"ref_histogram_create","malloc ref_histogram->stats of REF_DBL NULL");
            ref_histogram_ptr_local._4_4_ = 2;
          }
          else {
            for (local_28 = 0; local_28 < pRVar1->nstat; local_28 = local_28 + 1) {
              pRVar1->stats[local_28] = 0.0;
            }
            pRVar1->df = (FILE *)0x0;
            ref_histogram_ptr_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ref_histogram_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_create(REF_HISTOGRAM *ref_histogram_ptr) {
  REF_HISTOGRAM ref_histogram;

  ref_malloc(*ref_histogram_ptr, 1, REF_HISTOGRAM_STRUCT);
  ref_histogram = (*ref_histogram_ptr);

  ref_histogram_nbin(ref_histogram) = 18;
  ref_histogram_exp(ref_histogram) = 6.0;

  ref_malloc_init(ref_histogram->bins, ref_histogram_nbin(ref_histogram),
                  REF_INT, 0);

  ref_histogram_max(ref_histogram) = -1.0e20;
  ref_histogram_min(ref_histogram) = 1.0e20;
  ref_histogram_log_total(ref_histogram) = 0.0;
  ref_histogram_log_mean(ref_histogram) = 0.0;

  ref_histogram_nstat(ref_histogram) = 5;

  ref_malloc_init(ref_histogram->stats, ref_histogram_nstat(ref_histogram),
                  REF_DBL, 0.0);

  ref_histogram->df = NULL;

  return REF_SUCCESS;
}